

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

Names * __thiscall
cmGeneratorTarget::GetLibraryNames
          (Names *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  cmMakefile *this_00;
  bool bVar1;
  TargetType TVar2;
  string *psVar3;
  char *pcVar4;
  bool local_21a;
  string local_1c8;
  string local_1a8;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 local_128 [8];
  string suffix;
  string prefix;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  char *local_98;
  char *soversion;
  string local_88;
  char *local_68;
  char *version;
  undefined1 local_58 [8];
  string msg;
  string *config_local;
  cmGeneratorTarget *this_local;
  Names *targetNames;
  
  Names::Names(__return_storage_ptr__);
  bVar1 = IsImported(this);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_58,"GetLibraryNames called on imported target: ",
               (allocator<char> *)((long)&version + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&version + 7));
    psVar3 = GetName_abi_cxx11_(this);
    std::__cxx11::string::operator+=((string *)local_58,(string *)psVar3);
    cmLocalGenerator::IssueMessage(this->LocalGenerator,INTERNAL_ERROR,(string *)local_58);
    std::__cxx11::string::~string((string *)local_58);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"VERSION",(allocator<char> *)((long)&soversion + 7));
  pcVar4 = GetProperty(this,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)((long)&soversion + 7));
  local_68 = pcVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"SOVERSION",&local_b9);
  pcVar4 = GetProperty(this,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  prefix.field_2._M_local_buf[0xe] = '\0';
  prefix.field_2._M_local_buf[0xd] = '\0';
  local_98 = pcVar4;
  bVar1 = HasSOName(this,config);
  local_21a = true;
  if (bVar1) {
    this_00 = this->Makefile;
    std::allocator<char>::allocator();
    prefix.field_2._M_local_buf[0xe] = '\x01';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"CMAKE_PLATFORM_NO_VERSIONED_SONAME",
               (allocator<char> *)(prefix.field_2._M_local_buf + 0xf));
    prefix.field_2._M_local_buf[0xd] = '\x01';
    bVar1 = cmMakefile::IsOn(this_00,&local_e0);
    local_21a = true;
    if (!bVar1) {
      local_21a = IsFrameworkOnApple(this);
    }
  }
  if ((prefix.field_2._M_local_buf[0xd] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_e0);
  }
  if ((prefix.field_2._M_local_buf[0xe] & 1U) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)(prefix.field_2._M_local_buf + 0xf));
  }
  if (local_21a != false) {
    local_68 = (char *)0x0;
    local_98 = (char *)0x0;
  }
  if ((local_68 != (char *)0x0) && (local_98 == (char *)0x0)) {
    local_98 = local_68;
  }
  if ((local_68 == (char *)0x0) && (local_98 != (char *)0x0)) {
    local_68 = local_98;
  }
  std::__cxx11::string::string((string *)(suffix.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_128);
  GetFullNameInternal(this,config,RuntimeBinaryArtifact,(string *)(suffix.field_2._M_local_buf + 8),
                      &__return_storage_ptr__->Base,(string *)local_128);
  std::operator+(&local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&suffix.field_2 + 8),&__return_storage_ptr__->Base);
  std::operator+(&local_148,&local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->Output,(string *)&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  bVar1 = IsFrameworkOnApple(this);
  if (bVar1) {
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->Real,(string *)(suffix.field_2._M_local_buf + 8));
    bVar1 = cmMakefile::PlatformIsAppleEmbedded(this->Makefile);
    if (!bVar1) {
      std::__cxx11::string::operator+=((string *)&__return_storage_ptr__->Real,"Versions/");
      GetFrameworkVersion_abi_cxx11_(&local_188,this);
      std::__cxx11::string::operator+=((string *)&__return_storage_ptr__->Real,(string *)&local_188)
      ;
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::operator+=((string *)&__return_storage_ptr__->Real,"/");
    }
    std::__cxx11::string::operator+=
              ((string *)&__return_storage_ptr__->Real,(string *)__return_storage_ptr__);
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->SharedObject,
               (string *)&__return_storage_ptr__->Real);
  }
  else {
    ComputeVersionedName
              (this,&__return_storage_ptr__->SharedObject,(string *)((long)&suffix.field_2 + 8),
               &__return_storage_ptr__->Base,(string *)local_128,&__return_storage_ptr__->Output,
               local_98);
    ComputeVersionedName
              (this,&__return_storage_ptr__->Real,(string *)((long)&suffix.field_2 + 8),
               &__return_storage_ptr__->Base,(string *)local_128,&__return_storage_ptr__->Output,
               local_68);
  }
  TVar2 = GetType(this);
  if ((TVar2 == SHARED_LIBRARY) || (TVar2 = GetType(this), TVar2 == MODULE_LIBRARY)) {
    GetFullNameInternal(&local_1a8,this,config,ImportLibraryArtifact);
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->ImportLibrary,(string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
  }
  GetPDBName(&local_1c8,this,config);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->PDB,(string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)local_128);
  std::__cxx11::string::~string((string *)(suffix.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

cmGeneratorTarget::Names cmGeneratorTarget::GetLibraryNames(
  const std::string& config) const
{
  cmGeneratorTarget::Names targetNames;

  // This should not be called for imported targets.
  // TODO: Split cmTarget into a class hierarchy to get compile-time
  // enforcement of the limited imported target API.
  if (this->IsImported()) {
    std::string msg = "GetLibraryNames called on imported target: ";
    msg += this->GetName();
    this->LocalGenerator->IssueMessage(MessageType::INTERNAL_ERROR, msg);
  }

  // Check for library version properties.
  const char* version = this->GetProperty("VERSION");
  const char* soversion = this->GetProperty("SOVERSION");
  if (!this->HasSOName(config) ||
      this->Makefile->IsOn("CMAKE_PLATFORM_NO_VERSIONED_SONAME") ||
      this->IsFrameworkOnApple()) {
    // Versioning is supported only for shared libraries and modules,
    // and then only when the platform supports an soname flag.
    version = nullptr;
    soversion = nullptr;
  }
  if (version && !soversion) {
    // The soversion must be set if the library version is set.  Use
    // the library version as the soversion.
    soversion = version;
  }
  if (!version && soversion) {
    // Use the soversion as the library version.
    version = soversion;
  }

  // Get the components of the library name.
  std::string prefix;
  std::string suffix;
  this->GetFullNameInternal(config, cmStateEnums::RuntimeBinaryArtifact,
                            prefix, targetNames.Base, suffix);

  // The library name.
  targetNames.Output = prefix + targetNames.Base + suffix;

  if (this->IsFrameworkOnApple()) {
    targetNames.Real = prefix;
    if (!this->Makefile->PlatformIsAppleEmbedded()) {
      targetNames.Real += "Versions/";
      targetNames.Real += this->GetFrameworkVersion();
      targetNames.Real += "/";
    }
    targetNames.Real += targetNames.Base;
    targetNames.SharedObject = targetNames.Real;
  } else {
    // The library's soname.
    this->ComputeVersionedName(targetNames.SharedObject, prefix,
                               targetNames.Base, suffix, targetNames.Output,
                               soversion);

    // The library's real name on disk.
    this->ComputeVersionedName(targetNames.Real, prefix, targetNames.Base,
                               suffix, targetNames.Output, version);
  }

  // The import library name.
  if (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
      this->GetType() == cmStateEnums::MODULE_LIBRARY) {
    targetNames.ImportLibrary =
      this->GetFullNameInternal(config, cmStateEnums::ImportLibraryArtifact);
  }

  // The program database file name.
  targetNames.PDB = this->GetPDBName(config);

  return targetNames;
}